

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeadNode.h
# Opt level: O2

void __thiscall
duckdb_skiplistlib::skip_list::
HeadNode<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>
::at(HeadNode<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>
     *this,size_t index,size_t count,
    vector<std::pair<unsigned_long,_duckdb::interval_t>,_std::allocator<std::pair<unsigned_long,_duckdb::interval_t>_>_>
    *dest)

{
  pointer ppVar1;
  Node<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>
  *__x;
  bool bVar2;
  
  ppVar1 = (dest->
           super__Vector_base<std::pair<unsigned_long,_duckdb::interval_t>,_std::allocator<std::pair<unsigned_long,_duckdb::interval_t>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((dest->
      super__Vector_base<std::pair<unsigned_long,_duckdb::interval_t>,_std::allocator<std::pair<unsigned_long,_duckdb::interval_t>_>_>
      )._M_impl.super__Vector_impl_data._M_finish != ppVar1) {
    (dest->
    super__Vector_base<std::pair<unsigned_long,_duckdb::interval_t>,_std::allocator<std::pair<unsigned_long,_duckdb::interval_t>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = ppVar1;
  }
  __x = _nodeAt(this,index);
  while (bVar2 = count != 0, count = count - 1, bVar2) {
    if (__x == (Node<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>
                *)0x0) {
      _throw_exceeds_size(this->_count);
    }
    std::
    vector<std::pair<unsigned_long,_duckdb::interval_t>,_std::allocator<std::pair<unsigned_long,_duckdb::interval_t>_>_>
    ::push_back(dest,&__x->_value);
    __x = ((__x->_nodeRefs)._nodes.
           super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->pNode;
  }
  return;
}

Assistant:

void HeadNode<T, _Compare>::at(size_t index, size_t count,
                               std::vector<T> &dest) const {
#ifdef SKIPLIST_THREAD_SUPPORT
    std::lock_guard<std::mutex> lock(gSkipListMutex);
#endif
    dest.clear();
    const Node<T, _Compare> *pNode = _nodeAt(index);
    // _nodeAt will (should) throw an IndexError so this
    // assert should always be true
    assert(pNode);
    while (count) {
        if (! pNode) {
            _throw_exceeds_size(_count);
        }
        dest.push_back(pNode->value());
        pNode = pNode->next();
        --count;
    }
}